

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int bhitm(monst *mtmp,obj *otmp)

{
  char oclass;
  short otyp_00;
  uint uVar1;
  byte bVar2;
  boolean bVar3;
  uint oindx;
  int iVar4;
  int iVar5;
  char *pcVar6;
  obj *poVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int local_184;
  char *name;
  char nambuf [256];
  int oldinvis;
  boolean disguised_mimic;
  obj *obj;
  char *zap_type_text;
  int local_20;
  int otyp;
  int dmg;
  boolean dbldam;
  boolean reveal_invis;
  boolean wake;
  obj *otmp_local;
  monst *mtmp_local;
  
  bVar12 = true;
  bVar9 = urole.malenum == 0x15f;
  bVar10 = ((byte)u.uhave._0_1_ >> 4 & 1) != 0;
  otyp_00 = otmp->otyp;
  oindx = (uint)otyp_00;
  obj = (obj *)0x38f22e;
  bVar11 = false;
  if (mtmp->data->mlet == '\r') {
    bVar11 = mtmp->m_ap_type != '\0';
  }
  bVar13 = false;
  switch(oindx) {
  case 0x13a:
  case 0x19e:
  case 0x1c9:
    bVar3 = resists_magm(mtmp);
    if (bVar3 == '\0') {
      iVar5 = resist(mtmp,otmp->oclass,0,0);
      if (iVar5 == 0) {
        if (((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0) && (iVar5 = rn2(0x19), iVar5 == 0)) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_003468cf;
            if (((((u.uprops[0x1e].intrinsic == 0) &&
                  ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               (((u.uprops[0x40].intrinsic != 0 ||
                 ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                ((mtmp->data->mflags3 & 0x200) != 0)))) {
              bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
              goto joined_r0x003468c9;
            }
          }
          else {
            bVar2 = worm_known(level,mtmp);
joined_r0x003468c9:
            if (bVar2 != 0) {
LAB_003468cf:
              if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
                   || (u.uprops[0xc].extrinsic != 0)) ||
                  (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                 ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
                   ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) &&
                  (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
                pcVar6 = Monnam(mtmp);
                pline("%s shudders!",pcVar6);
                discover_object(oindx,'\x01','\x01');
              }
            }
          }
          for (_oldinvis = mtmp->minvent; _oldinvis != (obj *)0x0; _oldinvis = _oldinvis->nobj) {
            bypass_obj(_oldinvis);
          }
          xkilled(mtmp,3);
        }
        else {
          iVar5 = newcham(level,mtmp,(permonst *)0x0,oindx != 0x13a,'\0');
          if ((iVar5 != 0) &&
             (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
              ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0'))))))
          {
            if (mtmp->wormno == '\0') {
              if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
                 ((((u.uprops[0x1e].intrinsic == 0 &&
                    (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].intrinsic != 0 ||
                    ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))
                   && (((mtmp->data->mflags3 & 0x200) != 0 &&
                       ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)))))))) goto LAB_00346baf;
LAB_00346c3c:
              if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
                   ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
                    (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) ||
                  ((((u.uprops[0x1e].intrinsic == 0 &&
                     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                    (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                     (((((u.uprops[0x19].intrinsic == 0 &&
                         ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                        (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
                      (u.uprops[0x19].blocked != 0)))))) &&
                   (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                    (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar5)))
                   ))) && (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                           (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) break;
            }
            else {
              bVar3 = worm_known(level,mtmp);
              if (bVar3 == '\0') goto LAB_00346c3c;
LAB_00346baf:
              if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0))
                   && (u.uprops[0xc].extrinsic == 0)) &&
                  (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
                 ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 ||
                   ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)) ||
                  (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_00346c3c;
            }
            discover_object(oindx,'\x01','\x01');
          }
        }
      }
    }
    else {
      shieldeff(mtmp->mx,mtmp->my);
    }
    break;
  default:
    warning("What an interesting effect (%d)",(ulong)oindx);
    break;
  case 0x185:
  case 0x196:
    bVar13 = true;
    if (mtmp->data == mons + 0x145) {
      oclass = otmp->oclass;
      iVar5 = 4;
      if (oindx == 0x196) {
        iVar5 = 8;
      }
      iVar5 = dice(3,iVar5);
      resist(mtmp,oclass,iVar5,1);
    }
    else {
      bVar12 = false;
      iVar5 = 4;
      if (oindx == 0x196) {
        iVar5 = 8;
      }
      iVar5 = dice(6,iVar5);
      mtmp->mhp = iVar5 + mtmp->mhp;
      if (mtmp->mhpmax < mtmp->mhp) {
        mtmp->mhp = mtmp->mhpmax;
      }
      if (mtmp->mblinded != '\0') {
        mtmp->mblinded = '\0';
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffdffff | 0x20000;
      }
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_003473ec;
        if (((((u.uprops[0x1e].intrinsic == 0) &&
              ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           (((u.uprops[0x40].intrinsic != 0 ||
             ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
            ((mtmp->data->mflags3 & 0x200) != 0)))) {
          bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
          goto joined_r0x003473e6;
        }
      }
      else {
        bVar2 = worm_known(level,mtmp);
joined_r0x003473e6:
        if (bVar2 != 0) {
LAB_003473ec:
          if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))
             ) {
            if (bVar11) {
              if ((mtmp->m_ap_type == '\x02') && (mtmp->mappearance == 0)) {
                set_mimic_sym(mtmp,level);
                newsym((int)mtmp->mx,(int)mtmp->my);
              }
              else {
                mimic_hit_msg(mtmp,otyp_00);
              }
            }
            else {
              pcVar6 = Monnam(mtmp);
              pcVar8 = "";
              if (oindx == 0x196) {
                pcVar8 = " much";
              }
              pline("%s looks%s better.",pcVar6,pcVar8);
            }
          }
        }
      }
      if ((mtmp->mtame != '\0') || ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0)) {
        if (urole.malenum == 0x15e) {
          local_184 = 1;
        }
        else {
          local_184 = sgn((int)u.ualign.type);
        }
        adjalign(local_184);
      }
    }
    break;
  case 0x186:
  case 0x1cc:
    bVar12 = false;
    if (((u._1052_1_ & 1) == 0) || (mtmp != u.ustuck)) {
      poVar7 = which_armor(mtmp,0x100000);
      if (poVar7 != (obj *)0x0) {
        mtmp->misc_worn_check = (poVar7->owornmask ^ 0xffffffffU) & mtmp->misc_worn_check;
        update_mon_intrinsics(level,mtmp,poVar7,'\0','\0');
        poVar7->owornmask = 0;
        obj_extract_self(poVar7);
        place_object(poVar7,level,(int)mtmp->mx,(int)mtmp->my);
        newsym((int)mtmp->mx,(int)mtmp->my);
      }
    }
    else {
      if ((mtmp->data->mflags1 & 0x40000) != 0) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar6 = Monnam(mtmp);
          pline("%s opens its mouth!",pcVar6);
        }
        else {
          pline("You feel a sudden rush of air!");
        }
      }
      expels(mtmp,mtmp->data,'\x01');
    }
    break;
  case 0x187:
    goto switchD_00346409_caseD_187;
  case 0x18a:
    local_20 = rnd(8);
    if (bVar9 && bVar10) {
      local_20 = local_20 << 1;
    }
    if (oindx == 0x18a) {
      iVar5 = spell_damage_bonus();
      local_20 = iVar5 + local_20;
    }
    bVar3 = resists_drli(mtmp);
    if (bVar3 == '\0') {
      iVar5 = resist(mtmp,otmp->oclass,local_20,0);
      if ((iVar5 == 0) && (0 < mtmp->mhp)) {
        mtmp->mhp = mtmp->mhp - local_20;
        mtmp->mhpmax = mtmp->mhpmax - local_20;
        if ((mtmp->mhp < 1) || ((mtmp->mhpmax < 1 || (mtmp->m_lev == '\0')))) {
          xkilled(mtmp,1);
        }
        else {
          mtmp->m_lev = mtmp->m_lev + 0xff;
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (((((u.uprops[0x1e].intrinsic != 0) ||
                    (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                     (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                   ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                  ((u.uprops[0x40].intrinsic == 0 &&
                   ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0))))))
                 || ((mtmp->data->mflags3 & 0x200) == 0)) break;
              bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
              goto joined_r0x00347d61;
            }
          }
          else {
            bVar2 = worm_known(level,mtmp);
joined_r0x00347d61:
            if (bVar2 == 0) break;
          }
          if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))
             ) {
            pcVar6 = Monnam(mtmp);
            pline("%s suddenly seems weaker!",pcVar6);
          }
        }
      }
    }
    else {
      shieldeff(mtmp->mx,mtmp->my);
    }
    break;
  case 0x18b:
  case 0x1c6:
    iVar5 = resist(mtmp,otmp->oclass,0,0);
    if (iVar5 == 0) {
      mon_adjust_speed(mtmp,-1,otmp);
      m_dowear(level,mtmp,'\0');
      if ((((u._1052_1_ & 1) != 0) && (mtmp == u.ustuck)) &&
         ((mtmp->data->mlet == '\x16' || (mtmp->data == mons + 0x9f)))) {
        pcVar6 = mon_nam(mtmp);
        pline("You disrupt %s!",pcVar6);
        pline("A huge hole opens up...");
        expels(mtmp,mtmp->data,'\x01');
      }
    }
    break;
  case 0x18c:
  case 0x1c3:
  case 0x1cd:
    bVar12 = false;
    break;
  case 0x19d:
  case 0x1c8:
    iVar5 = unturn_dead(mtmp);
    bVar12 = iVar5 != 0;
    if ((mtmp->data->mflags2 & 2) != 0) {
      bVar13 = true;
      bVar12 = true;
      local_20 = rnd(8);
      if (bVar9 && bVar10) {
        local_20 = local_20 << 1;
      }
      if (oindx == 0x19d) {
        iVar5 = spell_damage_bonus();
        local_20 = iVar5 + local_20;
      }
      flags.bypasses = '\x01';
      iVar5 = resist(mtmp,otmp->oclass,local_20,0);
      if ((iVar5 == 0) && (0 < mtmp->mhp)) {
        monflee(mtmp,0,'\0','\x01');
      }
    }
    break;
  case 0x19f:
  case 0x1cb:
    bVar3 = u_teleport_mon(mtmp,'\x01');
    bVar13 = bVar3 == '\0';
    break;
  case 0x1a1:
  case 0x1ca:
    cancel_monst(mtmp,otmp,'\x01','\x01','\0');
    break;
  case 0x1a4:
    iVar5 = monsndx(mtmp->data);
    if (iVar5 == 0x108) {
      pcVar6 = Monnam(mtmp);
      iVar5 = newcham(level,mtmp,mons + 0x106,'\0','\0');
      if (iVar5 == 0) {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if (((((u.uprops[0x1e].intrinsic != 0) ||
                  (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                 ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                ((u.uprops[0x40].intrinsic == 0 &&
                 ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0))))))
               || ((mtmp->data->mflags3 & 0x200) == 0)) break;
            bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
            goto joined_r0x00347a74;
          }
        }
        else {
          bVar2 = worm_known(level,mtmp);
joined_r0x00347a74:
          if (bVar2 == 0) break;
        }
        if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
        {
          pline("%s looks rather fleshy for a moment.",pcVar6);
        }
      }
      else {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if ((((((u.uprops[0x1e].intrinsic != 0) ||
                   ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                  (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                 ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                ((u.uprops[0x40].intrinsic == 0 &&
                 ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0))))))
               || ((mtmp->data->mflags3 & 0x200) == 0)) break;
            bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
            goto joined_r0x00347875;
          }
        }
        else {
          bVar2 = worm_known(level,mtmp);
joined_r0x00347875:
          if (bVar2 == 0) break;
        }
        if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
              (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
            (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0))
        {
          pline("%s turns to flesh!",pcVar6);
        }
      }
    }
    else {
      bVar12 = false;
    }
    break;
  case 0x1be:
    iVar5 = flash_hits_mon(mtmp,otmp);
    bVar13 = iVar5 != 0;
    if (bVar13) {
      discover_object(0x1be,'\x01','\x01');
    }
    break;
  case 0x1c4:
    obj = (obj *)0x359650;
switchD_00346409_caseD_187:
    bVar13 = true;
    bVar3 = resists_magm(mtmp);
    if (bVar3 == '\0') {
      if ((u._1052_1_ & 1) == 0) {
        iVar5 = rnd(0x14);
        iVar4 = find_mac(mtmp);
        if (iVar5 < iVar4 + 10) goto LAB_00346486;
        miss((char *)obj,mtmp);
      }
      else {
LAB_00346486:
        local_20 = dice(2,0xc);
        if (bVar9 && bVar10) {
          local_20 = local_20 << 1;
        }
        if (oindx == 0x187) {
          iVar5 = spell_damage_bonus();
          local_20 = iVar5 + local_20;
        }
        pcVar6 = exclam(local_20);
        hit((char *)obj,'\0',mtmp,pcVar6);
        resist(mtmp,otmp->oclass,local_20,1);
      }
      discover_object(oindx,'\x01','\x01');
    }
    else {
      shieldeff(mtmp->mx,mtmp->my);
    }
    break;
  case 0x1c5:
    uVar1 = *(uint *)&mtmp->field_0x60;
    pcVar6 = Monnam(mtmp);
    strcpy((char *)&name,pcVar6);
    mon_set_minvis(mtmp);
    if ((((uVar1 >> 1 & 1) == 0) && ((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0)) &&
       ((((viz_array[mtmp->my][mtmp->mx] & 2U) != 0 &&
         ((((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)) ||
           (((youmonst.data)->mflags1 & 0x1000000) != 0)) ||
          ((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)))))) ||
        ((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         (((u.uprops[0x19].intrinsic & 0xf8ffffff) != 0 &&
          (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)))))))) {
      pline("%s turns transparent!",&name);
      discover_object(oindx,'\x01','\x01');
    }
    break;
  case 0x1c7:
    iVar5 = resist(mtmp,otmp->oclass,0,0);
    if (iVar5 == 0) {
      mon_adjust_speed(mtmp,1,otmp);
      m_dowear(level,mtmp,'\0');
    }
    break;
  case 0x1ce:
    bVar12 = false;
    bVar13 = true;
    probe_monster(mtmp);
    discover_object(oindx,'\x01','\x01');
    break;
  case 0x1d3:
    bVar13 = true;
    iVar5 = dice(otmp->spe + 1,0xc);
    iVar5 = sleep_monst(mtmp,iVar5,0xb);
    if (iVar5 != 0) {
      slept_monst(mtmp);
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      discover_object(0x1d3,'\x01','\x01');
    }
  }
  if (bVar12) {
    if (mtmp->mhp < 1) {
      if (mtmp->m_ap_type != '\0') {
        seemimic(mtmp);
      }
    }
    else {
      wakeup(mtmp);
      m_respond(mtmp);
      if (((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0) && (u.ushops[0] == '\0')) {
        hot_pursuit(mtmp);
      }
    }
  }
  if (!bVar13) {
    return 0;
  }
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          ((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
         ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_003480bc;
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x00348029;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
joined_r0x00348029:
    if (bVar2 == 0) goto LAB_003480bc;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    return 0;
  }
LAB_003480bc:
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
        (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
         (u.uprops[0x19].blocked != 0)))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar5)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
    map_invisible(bhitpos.x,bhitpos.y);
  }
  return 0;
}

Assistant:

int bhitm(struct monst *mtmp, struct obj *otmp)
{
	boolean wake = TRUE;	/* Most 'zaps' should wake monster */
	boolean reveal_invis = FALSE;
	boolean dbldam = Role_if (PM_KNIGHT) && u.uhave.questart;
	int dmg, otyp = otmp->otyp;
	const char *zap_type_text = "spell";
	struct obj *obj;
	boolean disguised_mimic = (mtmp->data->mlet == S_MIMIC &&
				   mtmp->m_ap_type != M_AP_NOTHING);

	if (u.uswallow && mtmp == u.ustuck)
	    reveal_invis = FALSE;

	switch(otyp) {
	case WAN_STRIKING:
		zap_type_text = "wand";
		/* fall through */
	case SPE_FORCE_BOLT:
		reveal_invis = TRUE;
		if (resists_magm(mtmp)) {	/* match effect on player */
			shieldeff(mtmp->mx, mtmp->my);
			break;	/* skip makeknown */
		} else if (u.uswallow || rnd(20) < 10 + find_mac(mtmp)) {
			dmg = dice(2,12);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_FORCE_BOLT)
			    dmg += spell_damage_bonus();
			hit(zap_type_text, FALSE, mtmp, exclam(dmg));
			resist(mtmp, otmp->oclass, dmg, TELL);
		} else miss(zap_type_text, mtmp);
		makeknown(otyp);
		break;
	case WAN_SLOW_MONSTER:
	case SPE_SLOW_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, -1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
			if (u.uswallow && (mtmp == u.ustuck) &&
			    is_whirly(mtmp->data)) {
				pline("You disrupt %s!", mon_nam(mtmp));
				pline("A huge hole opens up...");
				expels(mtmp, mtmp->data, TRUE);
			}
		}
		break;
	case WAN_SPEED_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, 1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
		}
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		wake = FALSE;
		if (unturn_dead(mtmp)) wake = TRUE;
		if (is_undead(mtmp->data)) {
			reveal_invis = TRUE;
			wake = TRUE;
			dmg = rnd(8);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_TURN_UNDEAD)
				dmg += spell_damage_bonus();
			flags.bypasses = TRUE;	/* for make_corpse() */
			if (!resist(mtmp, otmp->oclass, dmg, NOTELL)) {
			    if (mtmp->mhp > 0) monflee(mtmp, 0, FALSE, TRUE);
			}
		}
		break;
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
	case POT_POLYMORPH:
		if (resists_magm(mtmp)) {
		    /* magic resistance protects from polymorph traps, so make
		       it guard against involuntary polymorph attacks too... */
		    shieldeff(mtmp->mx, mtmp->my);
		} else if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
		    /* natural shapechangers aren't affected by system shock
		       (unless protection from shapechangers is interfering
		       with their metabolism...) */
		    if (mtmp->cham == CHAM_ORDINARY && !rn2(25)) {
			if (canseemon(level, mtmp)) {
			    pline("%s shudders!", Monnam(mtmp));
			    makeknown(otyp);
			}
			/* dropped inventory shouldn't be hit by this zap */
			for (obj = mtmp->minvent; obj; obj = obj->nobj)
			    bypass_obj(obj);
			/* flags.bypasses = TRUE; ## for make_corpse() */
			/* no corpse after system shock */
			xkilled(mtmp, 3);
		    } else if (newcham(level, mtmp, NULL,
				       (otyp != POT_POLYMORPH), FALSE)) {
			if (!Hallucination && canspotmon(level, mtmp))
			    makeknown(otyp);
		    }
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, TRUE, TRUE, FALSE);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		reveal_invis = !u_teleport_mon(mtmp, TRUE);
		break;
	case WAN_MAKE_INVISIBLE:
	    {
		int oldinvis = mtmp->minvis;
		char nambuf[BUFSZ];

		/* format monster's name before altering its visibility */
		strcpy(nambuf, Monnam(mtmp));
		mon_set_minvis(mtmp);
		if (!oldinvis && knowninvisible(mtmp)) {
		    pline("%s turns transparent!", nambuf);
		    makeknown(otyp);
		}
		break;
	    }
	case WAN_NOTHING:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		wake = FALSE;
		break;
	case WAN_PROBING:
		wake = FALSE;
		reveal_invis = TRUE;
		probe_monster(mtmp);
		makeknown(otyp);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
		wake = FALSE;	/* don't want immediate counterattack */
		if (u.uswallow && mtmp == u.ustuck) {
			if (is_animal(mtmp->data)) {
				if (Blind) pline("You feel a sudden rush of air!");
				else pline("%s opens its mouth!", Monnam(mtmp));
			}
			expels(mtmp, mtmp->data, TRUE);
		} else if (!!(obj = which_armor(mtmp, W_SADDLE))) {
			mtmp->misc_worn_check &= ~obj->owornmask;
			update_mon_intrinsics(level, mtmp, obj, FALSE, FALSE);
			obj->owornmask = 0L;
			obj_extract_self(obj);
			place_object(obj, level, mtmp->mx, mtmp->my);
			/* call stackobj() if we ever drop anything that can merge */
			newsym(mtmp->mx, mtmp->my);
		}
		break;
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		reveal_invis = TRUE;
	    if (mtmp->data != &mons[PM_PESTILENCE]) {
		wake = FALSE;		/* wakeup() makes the target angry */
		mtmp->mhp += dice(6, otyp == SPE_EXTRA_HEALING ? 8 : 4);
		if (mtmp->mhp > mtmp->mhpmax)
		    mtmp->mhp = mtmp->mhpmax;
		if (mtmp->mblinded) {
		    mtmp->mblinded = 0;
		    mtmp->mcansee = 1;
		}
		if (canseemon(level, mtmp)) {
		    if (disguised_mimic) {
			if (mtmp->m_ap_type == M_AP_OBJECT &&
			    mtmp->mappearance == STRANGE_OBJECT) {
			    /* it can do better now */
			    set_mimic_sym(mtmp, level);
			    newsym(mtmp->mx, mtmp->my);
			} else
			    mimic_hit_msg(mtmp, otyp);
		    } else pline("%s looks%s better.", Monnam(mtmp),
				 otyp == SPE_EXTRA_HEALING ? " much" : "" );
		}
		if (mtmp->mtame || mtmp->mpeaceful) {
		    adjalign(Role_if (PM_HEALER) ? 1 : sgn(u.ualign.type));
		}
	    } else {	/* Pestilence */
		/* Pestilence will always resist; damage is half of 3d{4,8} */
		resist(mtmp, otmp->oclass,
			      dice(3, otyp == SPE_EXTRA_HEALING ? 8 : 4), TELL);
	    }
		break;
	case WAN_LIGHT:	/* (broken wand) */
		if (flash_hits_mon(mtmp, otmp)) {
		    makeknown(WAN_LIGHT);
		    reveal_invis = TRUE;
		}
		break;
	case WAN_SLEEP:	/* (broken wand) */
		/* [wakeup() doesn't rouse victims of temporary sleep,
		    so it's okay to leave `wake' set to TRUE here] */
		reveal_invis = TRUE;
		if (sleep_monst(mtmp, dice(1 + otmp->spe, 12), WAND_CLASS))
		    slept_monst(mtmp);
		if (!Blind) makeknown(WAN_SLEEP);
		break;
	case SPE_STONE_TO_FLESH:
		if (monsndx(mtmp->data) == PM_STONE_GOLEM) {
		    char *name = Monnam(mtmp);
		    /* turn into flesh golem */
		    if (newcham(level, mtmp, &mons[PM_FLESH_GOLEM], FALSE, FALSE)) {
			if (canseemon(level, mtmp))
			    pline("%s turns to flesh!", name);
		    } else {
			if (canseemon(level, mtmp))
			    pline("%s looks rather fleshy for a moment.",
				  name);
		    }
		} else
		    wake = FALSE;
		break;
	case SPE_DRAIN_LIFE:
		dmg = rnd(8);
		if (dbldam) dmg *= 2;
		if (otyp == SPE_DRAIN_LIFE)
			dmg += spell_damage_bonus();
		if (resists_drli(mtmp))
		    shieldeff(mtmp->mx, mtmp->my);
		else if (!resist(mtmp, otmp->oclass, dmg, NOTELL) &&
				mtmp->mhp > 0) {
		    mtmp->mhp -= dmg;
		    mtmp->mhpmax -= dmg;
		    if (mtmp->mhp <= 0 || mtmp->mhpmax <= 0 || mtmp->m_lev < 1)
			xkilled(mtmp, 1);
		    else {
			mtmp->m_lev--;
			if (canseemon(level, mtmp))
			    pline("%s suddenly seems weaker!", Monnam(mtmp));
		    }
		}
		break;
	default:
		warning("What an interesting effect (%d)", otyp);
		break;
	}
	if (wake) {
	    if (mtmp->mhp > 0) {
		wakeup(mtmp);
		m_respond(mtmp);
		if (mtmp->isshk && !*u.ushops) hot_pursuit(mtmp);
	    } else if (mtmp->m_ap_type)
		seemimic(mtmp); /* might unblock if mimicing a boulder/door */
	}
	/* note: bhitpos won't be set if swallowed, but that's okay since
	 * reveal_invis will be false.  We can't use mtmp->mx, my since it
	 * might be an invisible worm hit on the tail.
	 */
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x, bhitpos.y) &&
							!canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}